

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O3

void __thiscall
icu_63::UnicodeString::UnicodeString(UnicodeString *this,UnicodeString *that,int32_t srcStart)

{
  short sVar1;
  int32_t iVar2;
  int srcStart_00;
  int iVar3;
  
  (this->super_Replaceable).super_UObject._vptr_UObject = (_func_int **)&PTR__UnicodeString_003be258
  ;
  (this->fUnion).fStackFields.fLengthAndFlags = 2;
  sVar1 = (that->fUnion).fStackFields.fLengthAndFlags;
  if (srcStart < 0) {
    iVar2 = (that->fUnion).fFields.fLength;
    iVar3 = (int)sVar1 >> 5;
    srcStart_00 = 0;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
    iVar2 = (that->fUnion).fFields.fLength;
    srcStart_00 = iVar3;
    if (sVar1 < 0) {
      srcStart_00 = iVar2;
    }
    if (srcStart <= srcStart_00) {
      srcStart_00 = srcStart;
    }
  }
  if (sVar1 < 0) {
    iVar3 = iVar2;
  }
  doReplace(this,0,0,that,srcStart_00,iVar3 - srcStart_00);
  return;
}

Assistant:

UnicodeString::UnicodeString(const UnicodeString& that,
                             int32_t srcStart) {
  fUnion.fFields.fLengthAndFlags = kShortString;
  setTo(that, srcStart);
}